

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

TranslationBlock_conflict * tcg_tb_alloc_mipsel(TCGContext_conflict4 *s)

{
  size_t sVar1;
  _Bool _Var2;
  TranslationBlock_conflict *pTVar3;
  void *pvVar4;
  long lVar5;
  
  lVar5 = (long)s->uc->qemu_icache_linesize;
  while( true ) {
    pTVar3 = (TranslationBlock_conflict *)((long)s->code_gen_ptr + lVar5 + -1 & -lVar5);
    pvVar4 = (void *)((long)pTVar3->jmp_dest + lVar5 + 0x17 & -lVar5);
    if (pvVar4 <= s->code_gen_highwater) {
      s->code_gen_ptr = pvVar4;
      s->data_gen_ptr = (void *)0x0;
      return pTVar3;
    }
    sVar1 = s->code_gen_buffer_size;
    _Var2 = tcg_region_alloc__locked(s);
    if (_Var2) break;
    (s->region).agg_size_full = ((s->region).agg_size_full + sVar1) - 0x400;
  }
  return (TranslationBlock_conflict *)0x0;
}

Assistant:

TranslationBlock *tcg_tb_alloc(TCGContext *s)
{
    uintptr_t align = s->uc->qemu_icache_linesize;
    TranslationBlock *tb;
    void *next;

 retry:
    tb = (void *)ROUND_UP((uintptr_t)s->code_gen_ptr, align);
    next = (void *)ROUND_UP((uintptr_t)(tb + 1), align);

    if (unlikely(next > s->code_gen_highwater)) {
        if (tcg_region_alloc(s)) {
            return NULL;
        }
        goto retry;
    }
    s->code_gen_ptr = next;
    s->data_gen_ptr = NULL;
    return tb;
}